

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  ptls_buffer_t *buf;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint8_t *__src;
  size_t sVar6;
  uint8_t *puVar7;
  ulong delta;
  ptls_iovec_t pVar8;
  int local_44;
  
  iVar2 = 0x32;
  if (rec->type == '\x16') {
    buf = &(tls->recvbuf).mess;
    if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
      __src = rec->fragment;
      sVar6 = rec->length;
    }
    else {
      uVar1 = tls->ctx->max_buffer_size;
      if ((uVar1 != 0) && (uVar1 < (tls->recvbuf).mess.off + rec->length)) {
        return 0x28;
      }
      iVar2 = ptls_buffer_reserve_aligned(buf,rec->length,'\0');
      if (iVar2 != 0) {
        return iVar2;
      }
      memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,rec->fragment,rec->length);
      __src = (tls->recvbuf).mess.base;
      sVar6 = (tls->recvbuf).mess.off + rec->length;
      (tls->recvbuf).mess.off = sVar6;
    }
    puVar7 = __src + sVar6;
    iVar3 = 0x202;
    do {
      sVar6 = (long)puVar7 - (long)__src;
      if ((long)sVar6 < 4) goto LAB_00115c95;
      sVar5 = (ulong)((uint)__src[2] << 8 | (uint)__src[1] << 0x10) + (ulong)__src[3] + 4;
      iVar4 = 3;
      if ((long)sVar5 <= (long)sVar6) {
        pVar8.len = sVar5;
        pVar8.base = __src;
        iVar3 = (*cb)(tls,emitter,pVar8,(uint)(sVar6 == sVar5),properties);
        if (((iVar3 == 0) || (iVar3 == 0x202)) || (iVar3 == 0x20b)) {
          __src = __src + sVar5;
          iVar4 = 0;
        }
        else {
          ptls_buffer__release_memory(buf);
          (tls->recvbuf).mess.off = 0;
          (tls->recvbuf).mess.is_allocated = '\0';
          (tls->recvbuf).mess.align_bits = '\0';
          *(undefined6 *)&(tls->recvbuf).mess.field_0x1a = 0;
          buf->base = (uint8_t *)0x0;
          (tls->recvbuf).mess.capacity = 0;
          iVar4 = 1;
          local_44 = iVar3;
        }
      }
    } while (iVar4 == 0);
    iVar2 = local_44;
    if (iVar4 == 3) {
LAB_00115c95:
      if (__src == puVar7) {
        ptls_buffer__release_memory(buf);
        (tls->recvbuf).mess.off = 0;
        (tls->recvbuf).mess.is_allocated = '\0';
        (tls->recvbuf).mess.align_bits = '\0';
        *(undefined6 *)&(tls->recvbuf).mess.field_0x1a = 0;
        buf->base = (uint8_t *)0x0;
        (tls->recvbuf).mess.capacity = 0;
        iVar2 = iVar3;
      }
      else {
        delta = (long)puVar7 - (long)__src;
        uVar1 = tls->ctx->max_buffer_size;
        if ((uVar1 == 0) || (iVar2 = 0x28, delta <= uVar1)) {
          if (buf->base == (uint8_t *)0x0) {
            (tls->recvbuf).mess.base = "";
            (tls->recvbuf).mess.capacity = 0;
            (tls->recvbuf).mess.off = 0;
            (tls->recvbuf).mess.is_allocated = '\0';
            (tls->recvbuf).mess.align_bits = '\0';
            iVar2 = ptls_buffer_reserve_aligned(buf,delta,'\0');
            if (iVar2 != 0) {
              return iVar2;
            }
            memcpy(buf->base,__src,delta);
          }
          else {
            memmove(buf->base,__src,delta);
          }
          (tls->recvbuf).mess.off = delta;
          iVar2 = 0x202;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;

    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    const uint8_t *src, *src_end;
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if (message_buffer_is_overflow(tls->ctx, tls->recvbuf.mess.off + rec->length))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        size_t mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_ASYNC_OPERATION:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        size_t new_size = src_end - src;
        if (message_buffer_is_overflow(tls->ctx, new_size))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, new_size)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, new_size);
        } else {
            memmove(tls->recvbuf.mess.base, src, new_size);
        }
        tls->recvbuf.mess.off = new_size;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}